

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O3

void __thiscall graphics101::VertexAndFaceArrays::~VertexAndFaceArrays(VertexAndFaceArrays *this)

{
  (*gl3wProcs.ptr[0x1a])(0);
  (*gl3wProcs.ptr[0x75])(1,this);
  this->m_VAO = 0;
  return;
}

Assistant:

VertexAndFaceArrays::~VertexAndFaceArrays()
{
    // Unbind the VAO
    glBindVertexArray( 0 );
    // Delete the VAO
    glDeleteVertexArrays( 1, &m_VAO );
    // The call to glDeleteVertexArrays() doesn't actually
    // change the value stored in m_VAO.
    // Let's set it to 0, which is an invalid value,
    // for the sake of people debugging.
    m_VAO = 0;
}